

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<Identifier,Identifier>
               (ostream *out,char *fmt,Identifier *args,Identifier *args_1)

{
  FormatListN<2> local_68;
  Identifier *local_28;
  Identifier *args_local_1;
  Identifier *args_local;
  char *fmt_local;
  ostream *out_local;
  
  local_28 = args_1;
  args_local_1 = args;
  args_local = (Identifier *)fmt;
  fmt_local = (char *)out;
  makeFormatList<Identifier,Identifier>(&local_68,(tinyformat *)args,args_1,args_1);
  vformat(out,fmt,&local_68.super_FormatList);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}